

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall
QComboBoxPrivateContainer::setItemView(QComboBoxPrivateContainer *this,QAbstractItemView *itemView)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QWidget *pQVar5;
  QScrollBar *pQVar6;
  QLayout *object;
  QBoxLayout *this_00;
  QStyle *pQVar7;
  ConnectionType type;
  long in_FS_OFFSET;
  Object local_e8 [8];
  undefined1 local_e0 [16];
  undefined8 local_d0;
  undefined1 local_c8 [8];
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QObject *)this->view != (QObject *)0x0) {
    QObject::removeEventFilter((QObject *)this->view);
    pQVar5 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this->view);
    QObject::removeEventFilter(&pQVar5->super_QObject);
    pQVar6 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this->view);
    QObject::disconnect<void(QAbstractSlider::*)(int),void(QComboBoxPrivateContainer::*)()>
              (&pQVar6->super_QAbstractSlider,
               (offset_in_QAbstractSlider_to_subr)QAbstractSlider::valueChanged,(Object *)0x0,
               (offset_in_QComboBoxPrivateContainer_to_subr)this);
    pQVar6 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this->view);
    QObject::disconnect<void(QAbstractSlider::*)(int,int),void(QComboBoxPrivateContainer::*)()>
              (&pQVar6->super_QAbstractSlider,
               (offset_in_QAbstractSlider_to_subr)QAbstractSlider::rangeChanged,(Object *)0x0,
               (offset_in_QComboBoxPrivateContainer_to_subr)this);
    QObject::disconnect<void(QObject::*)(QObject*),void(QComboBoxPrivateContainer::*)()>
              ((Object *)this->view,(offset_in_QObject_to_subr)QObject::destroyed,(Object *)0x0,
               (offset_in_QComboBoxPrivateContainer_to_subr)this);
    bVar2 = QWidget::isAncestorOf((QWidget *)this,(QWidget *)this->view);
    if ((bVar2) && (this->view != (QAbstractItemView *)0x0)) {
      (**(code **)(*(long *)&(this->view->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                  0x20))();
    }
  }
  this->view = itemView;
  QWidget::setParent((QWidget *)itemView,(QWidget *)this);
  QWidget::setAttribute((QWidget *)this->view,WA_MacShowFocusRect,false);
  object = QWidget::layout((QWidget *)this);
  this_00 = QtPrivate::qobject_cast_helper<QBoxLayout*,QObject>(&object->super_QObject);
  QBoxLayout::insertWidget
            (this_00,(uint)(this->top != (QComboBoxPrivateScroller *)0x0) * 2,(QWidget *)this->view,
             0,(Alignment)0x0);
  QWidget::setSizePolicy((QWidget *)this->view,(QSizePolicy)0xdd0000);
  QObject::installEventFilter((QObject *)this->view);
  pQVar5 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this->view);
  QObject::installEventFilter(&pQVar5->super_QObject);
  QAbstractScrollArea::setHorizontalScrollBarPolicy
            ((QAbstractScrollArea *)this->view,ScrollBarAlwaysOff);
  memset(&opt,0xaa,0x90);
  comboStyleOption(&opt,this);
  pQVar7 = QWidget::style(&this->combo->super_QWidget);
  iVar3 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x19,&opt,this->combo,0);
  if (iVar3 != 0) {
    QAbstractScrollArea::setVerticalScrollBarPolicy
              ((QAbstractScrollArea *)this->view,ScrollBarAlwaysOff);
  }
  pQVar7 = QWidget::style(&this->combo->super_QWidget);
  iVar4 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x13,&opt,this->combo,0);
  if (iVar4 != 0 || iVar3 != 0) {
    QWidget::setMouseTracking((QWidget *)this->view,true);
  }
  QAbstractItemView::setSelectionMode((QAbstractItemView *)this->view,SingleSelection);
  QFrame::setFrameStyle((QFrame *)this->view,0);
  QFrame::setLineWidth((QFrame *)this->view,0);
  QAbstractItemView::setEditTriggers((QAbstractItemView *)this->view,(EditTriggers)0x0);
  pQVar6 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this->view);
  local_e0._8_8_ = updateScrollers;
  local_d0._0_1_ = (QPaintDevice)0x0;
  local_d0._1_7_ = 0;
  type = (ConnectionType)this;
  QObject::connect<void(QAbstractSlider::*)(int),void(QComboBoxPrivateContainer::*)()>
            ((Object *)local_c8,(offset_in_QAbstractSlider_to_subr)pQVar6,
             (ContextType *)QAbstractSlider::valueChanged,
             (offset_in_QComboBoxPrivateContainer_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  pQVar6 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this->view);
  local_e0._8_8_ = updateScrollers;
  local_d0._0_1_ = (QPaintDevice)0x0;
  local_d0._1_7_ = 0;
  QObject::connect<void(QAbstractSlider::*)(int,int),void(QComboBoxPrivateContainer::*)()>
            ((Object *)local_e0,(offset_in_QAbstractSlider_to_subr)pQVar6,
             (ContextType *)QAbstractSlider::rangeChanged,
             (offset_in_QComboBoxPrivateContainer_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_e0);
  local_e0._8_8_ = viewDestroyed;
  local_d0._0_1_ = (QPaintDevice)0x0;
  local_d0._1_7_ = 0;
  QObject::connect<void(QObject::*)(QObject*),void(QComboBoxPrivateContainer::*)()>
            (local_e8,(offset_in_QObject_to_subr)this->view,(ContextType *)QObject::destroyed,
             (offset_in_QComboBoxPrivateContainer_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_e8);
  QStyleOptionComboBox::~QStyleOptionComboBox(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::setItemView(QAbstractItemView *itemView)
{
    Q_ASSERT(itemView);

    // clean up old one
    if (view) {
        view->removeEventFilter(this);
        view->viewport()->removeEventFilter(this);
#if QT_CONFIG(scrollbar)
        disconnect(view->verticalScrollBar(), &QScrollBar::valueChanged,
                   this, &QComboBoxPrivateContainer::updateScrollers);
        disconnect(view->verticalScrollBar(), &QScrollBar::rangeChanged,
                   this, &QComboBoxPrivateContainer::updateScrollers);
#endif
        disconnect(view, &QAbstractItemView::destroyed,
                   this, &QComboBoxPrivateContainer::viewDestroyed);

        if (isAncestorOf(view))
            delete view;
        view = nullptr;
    }

    // setup the item view
    view = itemView;
    view->setParent(this);
    view->setAttribute(Qt::WA_MacShowFocusRect, false);
    qobject_cast<QBoxLayout*>(layout())->insertWidget(top ? 2 : 0, view);
    view->setSizePolicy(QSizePolicy::Ignored, QSizePolicy::Ignored);
    view->installEventFilter(this);
    view->viewport()->installEventFilter(this);
    view->setHorizontalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    QStyleOptionComboBox opt = comboStyleOption();
    const bool usePopup = combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo);
#if QT_CONFIG(scrollbar)
    if (usePopup)
        view->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
#endif
    if (combo->style()->styleHint(QStyle::SH_ComboBox_ListMouseTracking, &opt, combo) ||
        usePopup) {
        view->setMouseTracking(true);
    }
    view->setSelectionMode(QAbstractItemView::SingleSelection);
    view->setFrameStyle(QFrame::NoFrame);
    view->setLineWidth(0);
    view->setEditTriggers(QAbstractItemView::NoEditTriggers);
#if QT_CONFIG(scrollbar)
    connect(view->verticalScrollBar(), &QScrollBar::valueChanged,
            this, &QComboBoxPrivateContainer::updateScrollers);
    connect(view->verticalScrollBar(), &QScrollBar::rangeChanged,
            this, &QComboBoxPrivateContainer::updateScrollers);
#endif
    connect(view, &QAbstractItemView::destroyed,
            this, &QComboBoxPrivateContainer::viewDestroyed);
}